

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::StateReplayer::~StateReplayer(StateReplayer *this)

{
  Impl *this_00;
  
  this_00 = this->impl;
  if (this_00 != (Impl *)0x0) {
    Impl::~Impl(this_00);
  }
  operator_delete(this_00,0x1d0);
  return;
}

Assistant:

StateReplayer::~StateReplayer()
{
	delete impl;
}